

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

tuple<bool,_float,_cv::Mat> *
removeCollapsnessIfPresent(tuple<bool,_float,_cv::Mat> *__return_storage_ptr__,Mat *inputImg)

{
  double dVar1;
  _InputArray *p_Var2;
  double dVar3;
  double local_790;
  bool local_781;
  tuple<bool,_double,_cv::Mat> local_780;
  double local_710;
  bool local_701;
  tuple<bool,_double,_cv::Mat> local_700;
  Scalar_<double> local_690;
  Scalar_<double> local_670;
  Mat local_650 [352];
  MatExpr local_4f0 [352];
  MatExpr local_390 [352];
  MatExpr local_230 [352];
  MatExpr local_d0 [8];
  Mat uncollapsed;
  double c;
  double a;
  double scalingFactor;
  double spreadnessPercentage;
  _InputArray local_40;
  double local_28;
  double max;
  double min;
  Mat *inputImg_local;
  
  min = (double)inputImg;
  inputImg_local = (Mat *)__return_storage_ptr__;
  cv::_InputArray::_InputArray(&local_40,inputImg);
  p_Var2 = (_InputArray *)cv::noArray();
  cv::minMaxLoc(&local_40,&max,&local_28,(Point_ *)0x0,(Point_ *)0x0,p_Var2);
  cv::_InputArray::~_InputArray(&local_40);
  dVar1 = min;
  dVar3 = (((local_28 - max) + 1.0) / 256.0) * 100.0;
  if (60.0 <= dVar3) {
    local_781 = false;
    local_790 = 100.0 - dVar3;
    std::make_tuple<bool,double,cv::Mat_const&>(&local_780,&local_781,&local_790,(Mat *)min);
    std::tuple<bool,_float,_cv::Mat>::tuple<bool,_double,_cv::Mat,_true,_true>
              (__return_storage_ptr__,&local_780);
    std::tuple<bool,_double,_cv::Mat>::~tuple(&local_780);
  }
  else {
    cv::Scalar_<double>::Scalar_(&local_670,max);
    cv::operator-(local_650,(Scalar_ *)dVar1);
    cv::operator*(local_4f0,256.0 / ((local_28 - max) + 1.0));
    cv::Scalar_<double>::Scalar_(&local_690,0.0);
    cv::operator+(local_390,(Scalar_ *)local_4f0);
    cv::operator*(local_230,1.15);
    cv::MatExpr::operator_cast_to_Mat(local_d0);
    cv::MatExpr::~MatExpr(local_230);
    cv::MatExpr::~MatExpr(local_390);
    cv::MatExpr::~MatExpr(local_4f0);
    cv::MatExpr::~MatExpr((MatExpr *)local_650);
    local_701 = true;
    local_710 = 100.0 - dVar3;
    std::make_tuple<bool,double,cv::Mat&>(&local_700,&local_701,&local_710,(Mat *)local_d0);
    std::tuple<bool,_float,_cv::Mat>::tuple<bool,_double,_cv::Mat,_true,_true>
              (__return_storage_ptr__,&local_700);
    std::tuple<bool,_double,_cv::Mat>::~tuple(&local_700);
    cv::Mat::~Mat((Mat *)local_d0);
  }
  return __return_storage_ptr__;
}

Assistant:

tuple<bool,float,Mat> removeCollapsnessIfPresent(Mat const& inputImg) {
    double min, max;

    minMaxLoc(inputImg, &min,&max);
    double spreadnessPercentage = (((max - min) + 1) / 256) * 100;

    if (spreadnessPercentage < 60) {
        double scalingFactor = 256 / ((max - min) + 1);
        double a = 0, c = min;
        Mat uncollapsed = ((inputImg - c) * (scalingFactor) + a)  * 1.15;
        return make_tuple(true, (100 - spreadnessPercentage), uncollapsed);
    }
    return make_tuple(false,(100 - spreadnessPercentage),inputImg);
}